

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O0

int bsp_remove_point(void *handle,float *point)

{
  int iVar1;
  undefined8 in_RDI;
  bsp_tree *tree;
  
  iVar1 = _bsp_remove_point((bsp_node *)point,(float *)tree,(int)((ulong)in_RDI >> 0x20));
  return iVar1;
}

Assistant:

int
_bsp_remove_point(
    bsp_node * node,
    float * point,
    int dimensions )
{
    
    if ( node->ge == NULL ) {
        int d, i, cnt;
        float ** points;
        cnt = array_count( node->idxarray );
        points = node->root->pointarrays;
        for ( i = 0; i < cnt; i++ ) {
            for ( d = 0; d < dimensions; d++ ) {
                if ( point[d] != points[d][node->idxarray[i]] )
                    break;
            }
            if ( d == dimensions ) {
                int oldidx = node->idxarray[i];
                array_remove_int_fast( node->idxarray, i );
                return oldidx;
            }
        }
        return -1;
    }

    if ( point[node->splitdim] >= node->splitpos )
        return _bsp_remove_point( node->ge, point, dimensions );
    else
        return _bsp_remove_point( node->lt, point, dimensions );
}